

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

_Bool scan_content(TSLexer *lexer,TSSymbol content_symbol,char end_char,uint n_delim,_Bool interp)

{
  bool bVar1;
  ushort uVar2;
  undefined3 in_register_00000011;
  bool bVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = lexer->lookahead;
  if (iVar4 != 0) {
    bVar3 = false;
    do {
      (*lexer->mark_end)(lexer);
      if (interp) {
        if ((iVar4 == 0x24) || (iVar4 == 0x5c)) {
LAB_0015292c:
          lexer->result_symbol = content_symbol;
          return bVar3;
        }
LAB_001528c6:
        uVar5 = n_delim;
        bVar1 = n_delim == 0;
        if (n_delim != 0) {
          do {
            if (lexer->lookahead != CONCAT31(in_register_00000011,end_char)) goto LAB_0015290d;
            (*lexer->advance)(lexer,false);
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
          bVar1 = true;
        }
        uVar2 = content_symbol;
        if (!bVar3) {
          (*lexer->mark_end)(lexer);
          uVar2 = end_char == '\"' | 0xe;
        }
        lexer->result_symbol = uVar2;
        if (bVar1) {
          return true;
        }
      }
      else {
        if (iVar4 != 0x5c) goto LAB_001528c6;
        (*lexer->advance)(lexer,false);
        if ((lexer->lookahead == CONCAT31(in_register_00000011,end_char)) ||
           (lexer->lookahead == 0x5c)) goto LAB_0015292c;
      }
LAB_0015290d:
      (*lexer->advance)(lexer,false);
      iVar4 = lexer->lookahead;
      bVar3 = true;
    } while (iVar4 != 0);
  }
  return false;
}

Assistant:

static bool scan_content(TSLexer *lexer, TSSymbol content_symbol, char end_char, unsigned n_delim, bool interp) {
    TSSymbol end_symbol = (end_char == '"') ? END_STR : END_CMD;
    bool has_content = false;
    int32_t next;
    while ((next = lexer->lookahead)) {
        mark_end(lexer);
        if (interp && (next == '$' || next == '\\')) {
            lexer->result_symbol = content_symbol;
            return has_content;
        } else if (next == '\\') {
            // Parse backslash in raw strings (check escaped delimiters and '\\')
            advance(lexer);
            next = lexer->lookahead;
            if (next == end_char || next == '\\') {
                lexer->result_symbol = content_symbol;
                return has_content;
            }
        } else {
            bool is_end_delimiter = true;
            for (unsigned i = 1; i <= n_delim; i++) {
                if (lexer->lookahead == end_char) {
                    advance(lexer);
                } else {
                    is_end_delimiter = false;
                    break;
                }
            }
            if (is_end_delimiter) {
                if (has_content) {
                    lexer->result_symbol = content_symbol;
                    return true;
                } else {
                    mark_end(lexer);
                    lexer->result_symbol = end_symbol;
                    return true;
                }
            }
        }
        advance(lexer);
        has_content = true;
    }
    return false;
}